

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O2

void __thiscall double_conversion::Bignum::Align(Bignum *this,Bignum *other)

{
  short sVar1;
  short sVar2;
  short sVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  
  sVar1 = this->exponent_;
  sVar2 = other->exponent_;
  if (sVar2 < sVar1) {
    uVar7 = (int)sVar1 - (int)sVar2;
    EnsureCapacity((int)this->used_bigits_ + uVar7);
    sVar3 = this->used_bigits_;
    for (lVar4 = (long)sVar3; 0 < lVar4; lVar4 = lVar4 + -1) {
      *(Chunk *)((long)this + lVar4 * 4 + (long)(int)sVar1 * 4 + (long)(int)sVar2 * -4) =
           this->bigits_buffer_[lVar4 + -1];
    }
    uVar5 = 0;
    uVar6 = 0;
    if (0 < (int)uVar7) {
      uVar6 = (ulong)uVar7;
    }
    for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      this->bigits_buffer_[uVar5] = 0;
    }
    this->used_bigits_ = sVar3 + (short)uVar7;
    this->exponent_ = this->exponent_ - (short)uVar7;
  }
  return;
}

Assistant:

void Bignum::Align(const Bignum& other) {
  if (exponent_ > other.exponent_) {
    // If "X" represents a "hidden" bigit (by the exponent) then we are in the
    // following case (a == this, b == other):
    // a:  aaaaaaXXXX   or a:   aaaaaXXX
    // b:     bbbbbbX      b: bbbbbbbbXX
    // We replace some of the hidden digits (X) of a with 0 digits.
    // a:  aaaaaa000X   or a:   aaaaa0XX
    const int zero_bigits = exponent_ - other.exponent_;
    EnsureCapacity(used_bigits_ + zero_bigits);
    for (int i = used_bigits_ - 1; i >= 0; --i) {
      RawBigit(i + zero_bigits) = RawBigit(i);
    }
    for (int i = 0; i < zero_bigits; ++i) {
      RawBigit(i) = 0;
    }
    used_bigits_ += static_cast<int16_t>(zero_bigits);
    exponent_ -= static_cast<int16_t>(zero_bigits);

    DOUBLE_CONVERSION_ASSERT(used_bigits_ >= 0);
    DOUBLE_CONVERSION_ASSERT(exponent_ >= 0);
  }
}